

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderPacked
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,Field *field,
          ObjectWriter *ow)

{
  byte bVar1;
  CodedInputStream *this_00;
  byte *pbVar2;
  pointer pcVar3;
  Limit limit;
  int iVar4;
  int64 iVar5;
  uint32 first_byte_or_zero;
  uint byte_limit;
  
  this_00 = this->stream_;
  pbVar2 = this_00->buffer_;
  if (pbVar2 < this_00->buffer_end_) {
    bVar1 = *pbVar2;
    byte_limit = (uint)bVar1;
    first_byte_or_zero = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      this_00->buffer_ = pbVar2 + 1;
      goto LAB_00321b1b;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  iVar5 = io::CodedInputStream::ReadVarint32Fallback(this_00,first_byte_or_zero);
  byte_limit = (uint)iVar5;
LAB_00321b1b:
  limit = io::CodedInputStream::PushLimit(this->stream_,byte_limit);
  iVar4 = io::CodedInputStream::BytesUntilLimit(this->stream_);
  if (0 < iVar4) {
    do {
      (*(this->super_ObjectSource)._vptr_ObjectSource[6])(__return_storage_ptr__,this,field,0,0,ow);
      if (__return_storage_ptr__->error_code_ != OK) {
        return __return_storage_ptr__;
      }
      pcVar3 = (__return_storage_ptr__->error_message_)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &(__return_storage_ptr__->error_message_).field_2) {
        operator_delete(pcVar3);
      }
      iVar4 = io::CodedInputStream::BytesUntilLimit(this->stream_);
    } while (0 < iVar4);
  }
  io::CodedInputStream::PopLimit(this->stream_,limit);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderPacked(
    const google::protobuf::Field* field, ObjectWriter* ow) const {
  uint32 length;
  stream_->ReadVarint32(&length);
  int old_limit = stream_->PushLimit(length);
  while (stream_->BytesUntilLimit() > 0) {
    RETURN_IF_ERROR(RenderField(field, StringPiece(), ow));
  }
  stream_->PopLimit(old_limit);
  return util::Status();
}